

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::ConversationAnimation(AActor *this,int animnum)

{
  FName local_2c;
  FName local_28;
  FName local_24;
  FState *local_20;
  FState *state;
  AActor *pAStack_10;
  int animnum_local;
  AActor *this_local;
  
  local_20 = (FState *)0x0;
  state._4_4_ = animnum;
  pAStack_10 = this;
  if (animnum == 0) {
    FName::FName(&local_24,NAME_Greetings);
    local_20 = FindState(this,&local_24);
  }
  else if (animnum == 1) {
    FName::FName(&local_28,NAME_Yes);
    local_20 = FindState(this,&local_28);
  }
  else if (animnum == 2) {
    FName::FName(&local_2c,NAME_No);
    local_20 = FindState(this,&local_2c);
  }
  if (local_20 != (FState *)0x0) {
    SetState(this,local_20,false);
  }
  return;
}

Assistant:

void AActor::ConversationAnimation (int animnum)
{
	FState * state = NULL;
	switch (animnum)
	{
	case 0:
		state = FindState(NAME_Greetings);
		break;
	case 1:
		state = FindState(NAME_Yes);
		break;
	case 2:
		state = FindState(NAME_No);
		break;
	}
	if (state != NULL) SetState(state);
}